

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

void __thiscall chrono::ChFrame<double>::ArchiveIN(ChFrame<double> *this,ChArchiveIn *marchive)

{
  ChArchiveIn *this_00;
  char in_R8B;
  ChNameValue<chrono::ChCoordsys<double>_> local_30;
  ChArchiveIn *local_18;
  ChArchiveIn *marchive_local;
  ChFrame<double> *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveIn *)this;
  ChArchiveIn::VersionRead<chrono::ChFrame<double>>(marchive);
  this_00 = local_18;
  make_ChNameValue<chrono::ChCoordsys<double>>
            (&local_30,(chrono *)"coord",(char *)&this->coord,(ChCoordsys<double> *)0x0,in_R8B);
  ChArchiveIn::operator>>(this_00,&local_30);
  ChNameValue<chrono::ChCoordsys<double>_>::~ChNameValue(&local_30);
  ChMatrix33<double>::Set_A_quaternion(&this->Amatrix,&(this->coord).rot);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive) {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<ChFrame<double>>();
        // stream in all member data
        marchive >> CHNVP(coord);
        Amatrix.Set_A_quaternion(coord.rot);
    }